

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<args::Command_*,_std::allocator<args::Command_*>_> * __thiscall
args::Group::GetCommands
          (vector<args::Command_*,_std::allocator<args::Command_*>_> *__return_storage_ptr__,
          Group *this)

{
  pointer ppBVar1;
  pointer ppBVar2;
  vector<args::Command_*,_std::allocator<args::Command_*>_> subparsers;
  _Vector_base<args::Command_*,_std::allocator<args::Command_*>_> local_38;
  
  (__return_storage_ptr__->super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1
      ) {
    (*(*ppBVar2)->_vptr_Base[5])(&local_38);
    std::vector<args::Command*,std::allocator<args::Command*>>::
    insert<__gnu_cxx::__normal_iterator<args::Command**,std::vector<args::Command*,std::allocator<args::Command*>>>,void>
              ((vector<args::Command*,std::allocator<args::Command*>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<args::Command_**,_std::vector<args::Command_*,_std::allocator<args::Command_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<args::Command_**,_std::vector<args::Command_*,_std::allocator<args::Command_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<args::Command_*,_std::allocator<args::Command_*>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Command*> GetCommands() override
            {
                std::vector<Command*> res;
                for (const auto &child : Children())
                {
                    auto subparsers = child->GetCommands();
                    res.insert(std::end(res), std::begin(subparsers), std::end(subparsers));
                }
                return res;
            }